

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfSelectClient.cpp
# Opt level: O2

void __thiscall xmrig::SelfSelectClient::submitBlockTemplate(SelfSelectClient *this,Value *result)

{
  int iVar1;
  Type pGVar2;
  undefined4 extraout_var;
  Value params;
  String local_128;
  StringRefType local_118;
  StringRefType local_108;
  StringRefType local_f8;
  StringRefType local_e8;
  StringRefType local_d8;
  StringRefType local_c8;
  StringRefType local_b8;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  StringRefType local_88;
  Document doc;
  
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument(&doc,kObjectType,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  params.data_.n = (Number)0x0;
  params.data_.s.str = (Ch *)0x3000000000000;
  local_b8.s = "id";
  local_b8.length = 2;
  String::toJSON(&local_128);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&params,&local_b8,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_128,doc.allocator_);
  local_c8.s = "job_id";
  local_c8.length = 6;
  String::toJSON(&local_128);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&params,&local_c8,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_128,doc.allocator_);
  local_d8.s = "blob";
  local_d8.length = 4;
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)result,"blocktemplate_blob");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&params,&local_d8,pGVar2,doc.allocator_);
  local_88.s = "height";
  local_88.length = 6;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>(&params,&local_88,(this->m_job).m_height,doc.allocator_);
  local_e8.s = "difficulty";
  local_e8.length = 10;
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)result,"difficulty");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&params,&local_e8,pGVar2,doc.allocator_);
  local_f8.s = "prev_hash";
  local_f8.length = 9;
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)result,"prev_hash");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&params,&local_f8,pGVar2,doc.allocator_);
  local_108.s = "seed_hash";
  local_108.length = 9;
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)result,"seed_hash");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&params,&local_108,pGVar2,doc.allocator_);
  local_118.s = "next_seed_hash";
  local_118.length = 0xe;
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)result,"next_seed_hash");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&params,&local_118,pGVar2,doc.allocator_);
  iVar1 = (*(this->super_IClient)._vptr_IClient[0xf])(this);
  JsonRequest::create(&doc,CONCAT44(extraout_var,iVar1),"block_template",&params);
  local_a8._8_8_ = 0;
  local_90 = std::
             _Function_handler<void_(const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_&,_bool,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/fart-master[P]blur-miner/src/base/net/stratum/SelfSelectClient.cpp:253:15)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_&,_bool,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/fart-master[P]blur-miner/src/base/net/stratum/SelfSelectClient.cpp:253:15)>
             ::_M_manager;
  local_a8._M_unused._M_object = this;
  (*(this->super_IClient)._vptr_IClient[0xd])(this,&doc);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument(&doc);
  return;
}

Assistant:

void xmrig::SelfSelectClient::submitBlockTemplate(rapidjson::Value &result)
{
    using namespace rapidjson;
    Document doc(kObjectType);
    auto &allocator = doc.GetAllocator();

    Value params(kObjectType);
    params.AddMember(StringRef(kId),            m_job.clientId().toJSON(), allocator);
    params.AddMember(StringRef(kJobId),         m_job.id().toJSON(), allocator);
    params.AddMember(StringRef(kBlob),          result[kBlocktemplateBlob], allocator);
    params.AddMember(StringRef(kHeight),        m_job.height(), allocator);
    params.AddMember(StringRef(kDifficulty),    result[kDifficulty], allocator);
    params.AddMember(StringRef(kPrevHash),      result[kPrevHash], allocator);
    params.AddMember(StringRef(kSeedHash),      result[kSeedHash], allocator);
    params.AddMember(StringRef(kNextSeedHash),  result[kNextSeedHash], allocator);

    JsonRequest::create(doc, sequence(), "block_template", params);

    send(doc, [this](const rapidjson::Value &result, bool success, uint64_t elapsed) {
        if (!success) {
            if (!isQuiet()) {
                LOG_ERR("[%s] error: " RED_BOLD("\"%s\"") RED_S ", code: %d", pool().daemon().url().data(), Json::getString(result, "message"), Json::getInt(result, "code"));
            }

            return retry();
        }

        if (!m_active) {
            return;
        }

        if (m_failures > m_retries) {
            m_listener->onLoginSuccess(this);
        }

        setState(IdleState);
        m_listener->onJobReceived(this, m_job, rapidjson::Value{});
    });
}